

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_sdr1(CPUPPCState_conflict2 *env)

{
  char *pcVar1;
  code *pcVar2;
  
  pcVar1 = env->spr_cb[0x19].name;
  if (env->has_hv_mode == true) {
    if (((pcVar1 != (char *)0x0) || (env->spr[0x19] != 0)) ||
       ((env->spr_cb[0x19].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0 ||
        (((env->spr_cb[0x19].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
          (env->spr_cb[0x19].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
         (env->spr_cb[0x19].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
LAB_00b78152:
      printf("Error: Trying to register SPR %d (%03x) twice !\n",0x19,0x19);
      exit(1);
    }
    env->spr_cb[0x19].name = "SDR1";
    pcVar2 = spr_noaccess;
    env->spr_cb[0x19].uea_read = spr_noaccess;
    env->spr_cb[0x19].uea_write = spr_noaccess;
    env->spr_cb[0x19].oea_read = spr_noaccess;
  }
  else {
    if ((((pcVar1 != (char *)0x0) || (env->spr[0x19] != 0)) ||
        (env->spr_cb[0x19].oea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
       (((env->spr_cb[0x19].oea_write != (_func_void_DisasContext_ptr_int_int *)0x0 ||
         (env->spr_cb[0x19].uea_read != (_func_void_DisasContext_ptr_int_int *)0x0)) ||
        (env->spr_cb[0x19].uea_write != (_func_void_DisasContext_ptr_int_int *)0x0))))
    goto LAB_00b78152;
    env->spr_cb[0x19].name = "SDR1";
    env->spr_cb[0x19].uea_read = spr_noaccess;
    env->spr_cb[0x19].uea_write = spr_noaccess;
    env->spr_cb[0x19].oea_read = spr_read_generic;
    pcVar2 = spr_write_sdr1;
  }
  env->spr_cb[0x19].oea_write = pcVar2;
  env->spr_cb[0x19].hea_read = spr_read_generic;
  env->spr_cb[0x19].hea_write = spr_write_sdr1;
  env->spr_cb[0x19].default_value = 0;
  env->spr[0x19] = 0;
  return;
}

Assistant:

static void gen_spr_sdr1(CPUPPCState *env)
{
    if (env->has_hv_mode) {
        /*
         * SDR1 is a hypervisor resource on CPUs which have a
         * hypervisor mode
         */
        spr_register_hv(env, SPR_SDR1, "SDR1",
                        SPR_NOACCESS, SPR_NOACCESS,
                        SPR_NOACCESS, SPR_NOACCESS,
                        &spr_read_generic, &spr_write_sdr1,
                        0x00000000);
    } else {
        spr_register(env, SPR_SDR1, "SDR1",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_sdr1,
                     0x00000000);
    }
}